

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6U>::
~SmallVector(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6U>
             *this)

{
  iterator S;
  iterator E;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6U>
  *this_local;
  
  S = SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::begin((SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)this);
  E = SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::end((SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             *)this);
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::destroy_range(S,E);
  SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~SmallVectorImpl(&this->
                      super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }